

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromFilm
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  memory_resource *pmVar1;
  undefined1 auVar2 [16];
  Vector3<float> v;
  undefined1 auVar3 [16];
  Normal3f n_00;
  Vector3f wi;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  const_reference pvVar8;
  byte in_CL;
  byte in_DL;
  int __x;
  long in_RDI;
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *this_00;
  Float FVar9;
  double dVar10;
  double dVar11;
  Ray *this_01;
  undefined8 uVar21;
  undefined1 auVar22 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Point3f PVar23;
  Vector3<float> VVar24;
  Float ta;
  Float eta_t;
  Float eta_i;
  Vector3f wt;
  Float apertureRadius2;
  Float r2;
  Point3f pHit;
  int vb;
  Float va;
  Float zCenter;
  Float radius;
  Normal3f n;
  Float t;
  bool isStop;
  LensElementInterface *element;
  int i;
  Ray ray;
  Float elementZ;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 uVar25;
  Float in_stack_fffffffffffffd3c;
  float in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  char *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  char (*in_stack_fffffffffffffd70) [2];
  undefined4 in_stack_fffffffffffffd78;
  Float in_stack_fffffffffffffd7c;
  char (*in_stack_fffffffffffffd80) [2];
  int *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffdbc;
  Float in_stack_fffffffffffffdc4;
  float local_224;
  float local_1e4;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Float *in_stack_fffffffffffffe38;
  Float in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  float in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Ray *in_stack_fffffffffffffe90;
  Float in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Ray *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float local_d4;
  float fStack_d0;
  float local_b8;
  undefined8 local_7c;
  undefined4 local_74;
  float local_70;
  int local_5c;
  undefined1 local_58 [20];
  float local_44;
  float local_20;
  byte local_1a;
  byte local_19;
  undefined1 auVar15 [64];
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_20 = 0.0;
  if ((DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar6 = __cxa_guard_acquire(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera),
     iVar6 != 0)) {
    Scale(in_stack_fffffffffffffdc4,(Float)((ulong)in_stack_fffffffffffffdbc >> 0x20),
          (Float)in_stack_fffffffffffffdbc);
    __cxa_guard_release(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  Transform::operator()
            ((Transform *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             in_stack_fffffffffffffed0,
             (Float *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  printf("{ ");
  FVar9 = TraceLensesFromFilm((RealisticCamera *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                              (Ray *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (Ray *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if ((FVar9 != 0.0) || (NAN(FVar9))) {
    printf("RGBColor[.5, .5, .8]");
  }
  else {
    printf("Dashed, RGBColor[.8, .5, .5]");
  }
  this_00 = (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             *)(in_RDI + 0x390);
  sVar7 = pstd::
          vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          ::size(this_00);
  local_5c = (int)sVar7;
  while( true ) {
    iVar6 = local_5c;
    local_5c = iVar6 + -1;
    __x = (int)this_00;
    if (local_5c < 0) break;
    pvVar8 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                           *)(in_RDI + 0x390),(long)local_5c);
    local_20 = local_20 - pvVar8->thickness;
    bVar5 = pvVar8->curvatureRadius != 0.0;
    Normal3<float>::Normal3((Normal3<float> *)0x8b4000);
    if (bVar5) {
      bVar4 = IntersectSphericalElement
                        ((Float)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         in_stack_fffffffffffffe90,
                         (Float *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         (Normal3f *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      if (!bVar4) goto LAB_008b4909;
    }
    else {
      local_70 = -((float)local_58._8_4_ - local_20) / local_44;
    }
    if (local_70 < 0.0) {
      LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],float&,char_const(&)[2],int&>
                ((LogLevel)((ulong)in_stack_fffffffffffffd60 >> 0x20),in_stack_fffffffffffffd58,
                 (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),in_stack_fffffffffffffd48,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd70,
                 (float *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
    }
    in_stack_fffffffffffffd88 = (int *)(double)(float)local_58._8_4_;
    dVar10 = (double)(float)local_58._0_4_;
    auVar22 = (undefined1  [56])0x0;
    this_00 = (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               *)local_58;
    PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd3c);
    auVar12._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar22;
    vmovlpd_avx(auVar12._0_16_);
    in_stack_fffffffffffffd80 = (char (*) [2])(double)PVar23.super_Tuple3<pbrt::Point3,_float>.z;
    auVar22 = (undefined1  [56])0x0;
    PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd3c);
    auVar13._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar22;
    uVar21 = vmovlpd_avx(auVar13._0_16_);
    local_b8 = (float)uVar21;
    printf(", Line[{{%f, %f}, {%f, %f}}]",in_stack_fffffffffffffd88,dVar10,in_stack_fffffffffffffd80
           ,(double)local_b8);
    auVar22 = (undefined1  [56])0x0;
    PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd3c);
    auVar14._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar22;
    pmVar1 = (memory_resource *)vmovlpd_avx(auVar14._0_16_);
    local_d4 = SUB84(pmVar1,0);
    fStack_d0 = (float)((ulong)pmVar1 >> 0x20);
    if (pvVar8->apertureRadius * pvVar8->apertureRadius <
        local_d4 * local_d4 + fStack_d0 * fStack_d0) goto LAB_008b4909;
    local_58._0_8_ = pmVar1;
    local_58._8_4_ = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
    if (bVar5) {
      Vector3<float>::Vector3((Vector3<float> *)0x8b4337);
      if (local_5c < 1) {
LAB_008b43bc:
        in_stack_fffffffffffffd7c = 1.0;
      }
      else {
        pvVar8 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x390),(long)(iVar6 + -2));
        if ((pvVar8->eta == 0.0) && (!NAN(pvVar8->eta))) goto LAB_008b43bc;
        pvVar8 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x390),(long)(iVar6 + -2));
        in_stack_fffffffffffffd7c = pvVar8->eta;
      }
      auVar22 = (undefined1  [56])0x0;
      VVar24 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffcf0);
      auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar22;
      vmovlpd_avx(auVar15._0_16_);
      auVar22 = ZEXT856(0);
      v.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffd3c;
      v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd38;
      v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffd40;
      VVar24 = Normalize<float>(v);
      auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar22;
      in_stack_fffffffffffffe90 = (Ray *)vmovlpd_avx(auVar16._0_16_);
      in_stack_fffffffffffffe80 = (float)local_7c;
      in_stack_fffffffffffffe84 = (undefined4)((ulong)local_7c >> 0x20);
      this_00 = (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 *)0x0;
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe7c;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe78;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe80;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffe60;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffe58;
      n_00.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      in_stack_fffffffffffffe88 = local_74;
      in_stack_fffffffffffffea0 = local_7c;
      bVar5 = Refract(wi,n_00,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                      (Vector3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if (!bVar5) goto LAB_008b4909;
      local_58._16_4_ = in_stack_ffffffffffffff08;
      local_58._12_4_ = in_stack_ffffffffffffff04;
      local_44 = in_stack_ffffffffffffff0c;
    }
  }
  auVar22 = ZEXT856(0);
  VVar24.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffd3c;
  VVar24.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd38;
  VVar24.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffd40;
  VVar24 = Normalize<float>(VVar24);
  local_44 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar22;
  local_58._12_8_ = vmovlpd_avx(auVar17._0_16_);
  std::abs(__x);
  if ((local_1a & 1) != 0) {
    auVar22 = (undefined1  [56])0x0;
    PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd3c);
    auVar18._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar18._8_56_ = auVar22;
    vmovlpd_avx(auVar18._0_16_);
    dVar10 = (double)PVar23.super_Tuple3<pbrt::Point3,_float>.z;
    uVar21 = 0;
    PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd3c);
    auVar3._8_8_ = uVar21;
    auVar3._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    uVar21 = vmovlpd_avx(auVar3);
    local_1e4 = (float)uVar21;
    printf(", Point[{%f, %f}]",dVar10,(double)local_1e4);
  }
  uVar25 = 0x32d2a74;
  if ((local_19 & 1) != 0) {
    uVar25 = 0x32d2a6e;
  }
  FVar9 = 0.0;
  dVar10 = (double)(float)local_58._8_4_;
  dVar11 = (double)(float)local_58._0_4_;
  auVar22 = (undefined1  [56])0x0;
  PVar23 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),0.0)
  ;
  auVar19._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar19._8_56_ = auVar22;
  vmovlpd_avx(auVar19._0_16_);
  this_01 = (Ray *)(double)PVar23.super_Tuple3<pbrt::Point3,_float>.z;
  auVar22 = (undefined1  [56])0x0;
  PVar23 = Ray::operator()(this_01,FVar9);
  auVar20._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar22;
  uVar21 = vmovlpd_avx(auVar20._0_16_);
  local_224 = (float)uVar21;
  printf(", %s[{{%f, %f}, {%f, %f}}]",dVar10,dVar11,this_01,(double)local_224,CONCAT44(FVar9,uVar25)
        );
  if ((local_1a & 1) != 0) {
    dVar10 = (double)(float)local_58._8_4_;
    uVar21 = 0;
    PVar23 = Ray::operator()(this_01,FVar9);
    auVar2._8_8_ = uVar21;
    auVar2._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar2);
    printf(", Line[{{%f, 0}, {%f, 0}}]",dVar10,
           (double)(PVar23.super_Tuple3<pbrt::Point3,_float>.z * 1.05));
  }
LAB_008b4909:
  printf("}");
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromFilm(const Ray &r, bool arrow,
                                          bool toOpticalIntercept) const {
    Float elementZ = 0;
    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    printf("{ ");
    if (TraceLensesFromFilm(r, nullptr) == 0) {
        printf("Dashed, RGBColor[.8, .5, .5]");
    } else
        printf("RGBColor[.5, .5, .8]");

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        elementZ -= element.thickness;
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                goto done;
        }
        CHECK_GE(t, 0);

        printf(", Line[{{%f, %f}, {%f, %f}}]", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            goto done;
        ray.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, nullptr, &wt))
                goto done;
            ray.d = wt;
        }
    }

    ray.d = Normalize(ray.d);
    {
        Float ta = std::abs(elementZ / 4);
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf(", Point[{%f, %f}]", ray(ta).z, ray(ta).x);
        }
        printf(", %s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);

        // overdraw the optical axis if needed...
        if (toOpticalIntercept)
            printf(", Line[{{%f, 0}, {%f, 0}}]", ray.o.z, ray(ta).z * 1.05f);
    }

done:
    printf("}");
}